

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

void boost::unordered::detail::foa::
     table_arrays<const_slang::ast::Symbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<const_slang::ast::Symbol_*>_>
     ::set_arrays(char *arrays)

{
  byte bVar1;
  pointer ppSVar2;
  long lVar3;
  void *__s;
  allocator_type sal;
  
  bVar1 = -*arrays;
  ppSVar2 = std::allocator_traits<std::allocator<const_slang::ast::Symbol_*>_>::allocate
                      (&sal,(0x88L << (bVar1 & 0x3f)) + 0xeU >> 3);
  lVar3 = 0x78L << (bVar1 & 0x3f);
  *(pointer *)(arrays + 0x18) = ppSVar2;
  __s = (void *)((long)ppSVar2 + (ulong)(-((int)ppSVar2 + (int)lVar3 + -8) & 0xf) + lVar3 + -8);
  *(void **)(arrays + 0x10) = __s;
  memset(__s,0,0x10L << (bVar1 & 0x3f));
  *(undefined1 *)(*(long *)(arrays + 0x10) + -2 + (1L << (bVar1 & 0x3f)) * 0x10) = 1;
  return;
}

Assistant:

static void set_arrays(table_arrays& arrays, allocator_type al, std::size_t,
                           std::false_type /* always allocate */) {
        using storage_traits = std::allocator_traits<allocator_type>;
        auto groups_size_index = arrays.groups_size_index;
        auto groups_size = size_policy::size(groups_size_index);

        auto sal = allocator_type(al);
        arrays.elements_ = storage_traits::allocate(sal, buffer_size(groups_size));

        /* Align arrays.groups to sizeof(group_type). table_iterator critically
         * depends on such alignment for its increment operation.
         */

        auto p = reinterpret_cast<unsigned char*>(arrays.elements() + groups_size * N - 1);
        p += (uintptr_t(sizeof(group_type)) - reinterpret_cast<uintptr_t>(p)) % sizeof(group_type);
        arrays.groups_ = group_type_pointer_traits::pointer_to(*reinterpret_cast<group_type*>(p));

        initialize_groups(arrays.groups(), groups_size,
                          is_trivially_default_constructible<group_type>{});
        arrays.groups()[groups_size - 1].set_sentinel();
    }